

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cc
# Opt level: O3

void __thiscall Volume::simplePreVisualize(Volume *this,Mat *src,Point *obs)

{
  Object *pOVar1;
  pointer pEVar2;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar3;
  size_t sVar4;
  _Elt_pointer pMVar5;
  _Elt_pointer pMVar6;
  Object *this_00;
  long *local_b8 [2];
  long local_a8 [2];
  undefined8 local_98;
  Point local_90;
  char str [8];
  _InputArray local_80;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = *(Object **)(this + 0x20);
  pOVar1 = *(Object **)(this + 0x28);
  if (this_00 != pOVar1) {
    local_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0x406fe000;
    do {
      local_90 = *obs;
      Object::visualizeEdges(this_00,src,&local_90);
      snprintf(str,8,"%d",(ulong)(uint)this_00->id);
      local_80.sz.width = 0;
      local_80.sz.height = 0;
      local_80.flags = 0x3010000;
      local_b8[0] = local_a8;
      local_80.obj = src;
      sVar4 = strlen(str);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,str,str + sVar4);
      pEVar2 = (this_00->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar5 = ((iterator *)
               ((long)&(pEVar2->
                       super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ).
                       super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl + 0x30))->_M_cur;
      if (pMVar5 == *(_Elt_pointer *)
                     ((long)&(pEVar2->
                             super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             ).
                             super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             ._M_impl + 0x38)) {
        pMVar3 = (*(_Map_pointer *)
                   ((long)&(pEVar2->
                           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ).
                           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl + 0x48))[-1];
        pMVar6 = pMVar3 + 0x14;
        pMVar5 = pMVar3 + 0x15;
      }
      else {
        pMVar6 = pMVar5 + -1;
      }
      local_98 = CONCAT44((int)*(double *)
                                ((long)&pMVar5[-1].
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        .m_storage.m_data + 8) + 10,
                          (int)(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                               ).m_storage.m_data.array[0] + 10);
      local_58 = CONCAT44(uStack_64,local_68);
      uStack_50 = CONCAT44(uStack_5c,uStack_60);
      local_48 = 0x406fe00000000000;
      uStack_40 = 0;
      cv::putText(0,&local_80,local_b8,&local_98,1,&local_58,1,8,0);
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pOVar1);
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"tmp","");
  local_80.sz.width = 0;
  local_80.sz.height = 0;
  local_80.flags = 0x1010000;
  local_80.obj = src;
  cv::imshow((string *)local_b8,&local_80);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  cv::waitKey(0);
  return;
}

Assistant:

void Volume::simplePreVisualize(cv::Mat& src, const cv::Point& obs) const {
    for (const Object& obj: objs) {
        obj.visualizeEdges(src, obs);
        char str[8];
        snprintf(str, 8, "%d", obj.id);
		cv::putText(src, str, cv::Point(obj.edges.front().back().x(), obj.edges.front().back().y()) + cv::Point(10, 10),
				cv::FONT_HERSHEY_PLAIN, 1.5, cv::Scalar(0, 255, 255));
    }
    cv::imshow("tmp", src);
    cv::waitKey(0);
}